

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcherMt.cpp
# Opt level: O1

void __thiscall
cbtCollisionDispatcherMt::dispatchAllCollisionPairs
          (cbtCollisionDispatcherMt *this,cbtOverlappingPairCache *pairCache,cbtDispatcherInfo *info
          ,cbtDispatcher *dispatcher)

{
  cbtPersistentManifold **ppcVar1;
  long *plVar2;
  uint iEnd;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  long lVar5;
  CollisionDispatcherUpdater updater;
  cbtIParallelForBody local_58;
  undefined8 local_50;
  cbtNearCallback p_Stack_48;
  cbtCollisionDispatcherMt *pcStack_40;
  cbtDispatcherInfo *pcStack_38;
  
  iEnd = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[9])
                   (pairCache);
  if (iEnd != 0) {
    local_58._vptr_cbtIParallelForBody = (_func_int **)&PTR__cbtIParallelForBody_00b6fb68;
    local_50 = 0;
    pcStack_40 = (cbtCollisionDispatcherMt *)0x0;
    pcStack_38 = (cbtDispatcherInfo *)0x0;
    p_Stack_48 = (this->super_cbtCollisionDispatcher).m_nearCallback;
    iVar3 = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[5])();
    local_50 = CONCAT44(extraout_var,iVar3);
    this->m_batchUpdating = true;
    pcStack_40 = this;
    pcStack_38 = info;
    cbtParallelFor(0,iEnd,this->m_grainSize,&local_58);
    this->m_batchUpdating = false;
    if (((this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size < 0) &&
       ((this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_capacity < 0)) {
      ppcVar1 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data;
      if (ppcVar1 != (cbtPersistentManifold **)0x0) {
        if ((this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_ownsMemory == true) {
          cbtAlignedFreeInternal(ppcVar1);
        }
        (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data = (cbtPersistentManifold **)0x0;
      }
      (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_ownsMemory = true;
      (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data = (cbtPersistentManifold **)0x0;
      (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_capacity = 0;
    }
    (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size = 0;
    iVar3 = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[5])
                      (pairCache);
    if (0 < (int)iEnd) {
      lVar5 = 0;
      do {
        plVar2 = *(long **)(CONCAT44(extraout_var_00,iVar3) + 0x10 + lVar5);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x20))(plVar2,&(this->super_cbtCollisionDispatcher).m_manifoldsPtr)
          ;
        }
        lVar5 = lVar5 + 0x20;
      } while ((ulong)iEnd << 5 != lVar5);
    }
    lVar5 = (long)(this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size;
    if (0 < lVar5) {
      ppcVar1 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data;
      lVar4 = 0;
      do {
        ppcVar1[lVar4]->m_index1a = (int)lVar4;
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
  }
  return;
}

Assistant:

void cbtCollisionDispatcherMt::dispatchAllCollisionPairs(cbtOverlappingPairCache* pairCache, const cbtDispatcherInfo& info, cbtDispatcher* dispatcher)
{
	int pairCount = pairCache->getNumOverlappingPairs();
	if (pairCount == 0)
	{
		return;
	}
	CollisionDispatcherUpdater updater;
	updater.mCallback = getNearCallback();
	updater.mPairArray = pairCache->getOverlappingPairArrayPtr();
	updater.mDispatcher = this;
	updater.mInfo = &info;

	m_batchUpdating = true;
	cbtParallelFor(0, pairCount, m_grainSize, updater);
	m_batchUpdating = false;

	// reconstruct the manifolds array to ensure determinism
	m_manifoldsPtr.resizeNoInitialize(0);

	cbtBroadphasePair* pairs = pairCache->getOverlappingPairArrayPtr();
	for (int i = 0; i < pairCount; ++i)
	{
		if (cbtCollisionAlgorithm* algo = pairs[i].m_algorithm)
		{
			algo->getAllContactManifolds(m_manifoldsPtr);
		}
	}

	// update the indices (used when releasing manifolds)
	for (int i = 0; i < m_manifoldsPtr.size(); ++i)
	{
		m_manifoldsPtr[i]->m_index1a = i;
	}
}